

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O1

int i2c_ASN1_BIT_STRING(ASN1_BIT_STRING *a,uchar **pp)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  uchar *puVar3;
  uint8_t bits;
  uchar local_31;
  
  local_31 = (uchar)((ulong)in_RAX >> 0x38);
  if (a == (ASN1_BIT_STRING *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar1 = asn1_bit_string_length((ASN1_BIT_STRING *)a,&local_31);
    if (iVar1 == 0x7fffffff) {
      iVar2 = 0;
      ERR_put_error(0xc,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                    ,0x4f);
    }
    else {
      iVar2 = iVar1 + 1;
      if (pp != (uchar **)0x0) {
        puVar3 = *pp;
        *puVar3 = local_31;
        puVar3 = puVar3 + 1;
        if (iVar1 != 0) {
          memcpy(puVar3,a->data,(long)iVar1);
        }
        *pp = puVar3 + iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int i2c_ASN1_BIT_STRING(const ASN1_BIT_STRING *a, unsigned char **pp) {
  if (a == NULL) {
    return 0;
  }

  uint8_t bits;
  int len = asn1_bit_string_length(a, &bits);
  if (len > INT_MAX - 1) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return 0;
  }
  int ret = 1 + len;
  if (pp == NULL) {
    return ret;
  }

  uint8_t *p = *pp;
  *(p++) = bits;
  OPENSSL_memcpy(p, a->data, len);
  if (len > 0) {
    p[len - 1] &= (0xff << bits);
  }
  p += len;
  *pp = p;
  return ret;
}